

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O3

uint __thiscall ON_SubDMeshFragmentIterator::FragmentCount(ON_SubDMeshFragmentIterator *this)

{
  uint uVar1;
  ON_SubDMeshFragment *pOVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  ON_SubDMeshFragmentIterator frit;
  ON_SubDMeshFragmentIterator OStack_a8;
  
  if (this->m_bHaveCounts == false) {
    ON_SubDMeshFragmentIterator(&OStack_a8,this);
    pOVar2 = FirstFragment(&OStack_a8);
    uVar4 = 0;
    uVar6 = 0;
    uVar5 = 0;
    while (pOVar2 != (ON_SubDMeshFragment *)0x0) {
      if (pOVar2->m_face_fragment_count != 0) {
        if (pOVar2->m_face_fragment_count == 1) {
          uVar6 = uVar6 + 1;
          if (uVar5 == 0) {
            uVar5 = (uint)(pOVar2->m_grid).m_side_segment_count;
          }
        }
        else {
          uVar4 = uVar4 + 1;
          if (uVar5 == 0) {
            uVar5 = (uint)(pOVar2->m_grid).m_side_segment_count * 2;
          }
        }
      }
      pOVar2 = NextFragment(&OStack_a8);
    }
    uVar1 = 0;
    if (1 < uVar5) {
      uVar1 = 0;
      uVar3 = 1;
      do {
        uVar1 = uVar1 + 1;
        uVar3 = uVar3 * 2;
      } while (uVar3 < uVar5);
    }
    this->m_maximum_mesh_density = uVar1;
    this->m_full_size_fragment_count = uVar6;
    this->m_half_size_fragment_count = uVar4;
    this->m_bHaveCounts = true;
    ~ON_SubDMeshFragmentIterator(&OStack_a8);
  }
  return this->m_half_size_fragment_count + this->m_full_size_fragment_count;
}

Assistant:

unsigned int ON_SubDMeshFragmentIterator::FragmentCount() const
{
  if ( false  == m_bHaveCounts )
  {
    // lazy evaluation of this value because it's frequently never used.
    ON_SubDMeshFragmentIterator frit(*this);
    unsigned int side_count = 0;
    unsigned int full_size_fragment_count = 0;
    unsigned int half_size_fragment_count = 0;
    for (const ON_SubDMeshFragment* fragment = frit.FirstFragment(); nullptr != fragment; fragment = frit.NextFragment())
    {
      if ( 1 == fragment->m_face_fragment_count )
      {
        ++full_size_fragment_count;
        if (0 == side_count)
          side_count = fragment->m_grid.SideSegmentCount();
      }
      else if (fragment->m_face_fragment_count > 1)
      {
        ++half_size_fragment_count;
        if (0 == side_count)
          side_count = 2*fragment->m_grid.SideSegmentCount();
      }
    }
    unsigned int mesh_density = 0;
    for (unsigned int i = 1; i < side_count; i *= 2)
      ++mesh_density;

    m_maximum_mesh_density = mesh_density;
    m_full_size_fragment_count = full_size_fragment_count;
    m_half_size_fragment_count = half_size_fragment_count;

    m_bHaveCounts = true;
  }
  return m_full_size_fragment_count + m_half_size_fragment_count;
}